

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O0

void __thiscall xray_re::xr_reader::r_sz(xr_reader *this,string *value)

{
  uchar *__last;
  uchar *local_20;
  uint8_t *p;
  string *value_local;
  xr_reader *this_local;
  
  local_20 = (this->field_2).m_p;
  if (this->m_end <= (this->field_2).m_p) {
    __assert_fail("p < m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                  ,0x8b,"void xray_re::xr_reader::r_sz(std::string &)");
  }
  do {
    __last = local_20 + 1;
    if (*local_20 == '\0') {
      std::__cxx11::string::assign<unsigned_char_const*,void>
                ((string *)value,(this->field_2).m_p,local_20);
      (this->field_2).m_p = __last;
      return;
    }
    local_20 = __last;
  } while (__last < this->m_end);
  std::__cxx11::string::assign<unsigned_char_const*,void>
            ((string *)value,(this->field_2).m_p,__last);
  (this->field_2).m_p = __last;
  return;
}

Assistant:

void xr_reader::r_sz(std::string& value)
{
	const uint8_t* p = m_p;
	xr_assert(p < m_end);
	while (*p++) {
		// FIXME: we should crash in debug mode if no '\0' in the chunk,
		// but that is not good for older models (from 2215).
		// update: OGF_S_LODS 
		// assert(p < m_end);
		if (p >= m_end) {
			value.assign(m_p, p);
			m_p = p;
			return;
		}
	}
	value.assign(m_p, p - 1);
	m_p = p;
}